

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

_Bool http_handler_host_match(nni_http_handler *h,char *host)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  size_t n;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  size_t len;
  nng_sockaddr sa;
  char *host_local;
  nni_http_handler *h_local;
  
  sa.s_storage.sa_pad[0xf] = (uint64_t)host;
  host_local = (char *)h;
  n = strlen(h->host);
  if (n == 0) {
    h_local._7_1_ = true;
  }
  else if (sa.s_storage.sa_pad[0xf] == 0) {
    h_local._7_1_ = false;
  }
  else {
    if ((host_local[0x5b8] & 1U) != 0) {
      iVar7 = nni_parse_ip_port((char *)sa.s_storage.sa_pad[0xf],(nni_sockaddr *)&len);
      if (iVar7 != 0) {
        return false;
      }
      if (*(short *)(host_local + 0x530) == 3) {
        if (((short)len == 3) && (len._4_4_ == *(int *)(host_local + 0x534))) {
          return true;
        }
        return false;
      }
      if (*(short *)(host_local + 0x530) == 4) {
        if ((short)len != 4) {
          return false;
        }
        cVar8 = -(len._6_1_ == host_local[0x536]);
        cVar9 = -(len._7_1_ == host_local[0x537]);
        cVar10 = -(sa.s_family._0_1_ == host_local[0x538]);
        cVar11 = -(sa.s_family._1_1_ == host_local[0x539]);
        cVar12 = -(sa.s_ipc.sa_path[0] == host_local[0x53a]);
        cVar13 = -(sa.s_ipc.sa_path[1] == host_local[0x53b]);
        cVar14 = -(sa.s_ipc.sa_path[2] == host_local[0x53c]);
        cVar15 = -(sa.s_ipc.sa_path[3] == host_local[0x53d]);
        cVar16 = -(sa.s_ipc.sa_path[4] == host_local[0x53e]);
        cVar17 = -(sa.s_ipc.sa_path[5] == host_local[0x53f]);
        cVar18 = -(sa.s_ipc.sa_path[6] == host_local[0x540]);
        cVar19 = -(sa.s_ipc.sa_path[7] == host_local[0x541]);
        cVar20 = -(sa.s_ipc.sa_path[8] == host_local[0x542]);
        bVar21 = -(sa.s_ipc.sa_path[9] == host_local[0x543]);
        auVar1[1] = -(len._5_1_ == host_local[0x535]);
        auVar1[0] = -(len._4_1_ == host_local[0x534]);
        auVar1[2] = cVar8;
        auVar1[3] = cVar9;
        auVar1[4] = cVar10;
        auVar1[5] = cVar11;
        auVar1[6] = cVar12;
        auVar1[7] = cVar13;
        auVar1[8] = cVar14;
        auVar1[9] = cVar15;
        auVar1[10] = cVar16;
        auVar1[0xb] = cVar17;
        auVar1[0xc] = cVar18;
        auVar1[0xd] = cVar19;
        auVar1[0xe] = cVar20;
        auVar1[0xf] = bVar21;
        auVar2[1] = -(len._5_1_ == host_local[0x535]);
        auVar2[0] = -(len._4_1_ == host_local[0x534]);
        auVar2[2] = cVar8;
        auVar2[3] = cVar9;
        auVar2[4] = cVar10;
        auVar2[5] = cVar11;
        auVar2[6] = cVar12;
        auVar2[7] = cVar13;
        auVar2[8] = cVar14;
        auVar2[9] = cVar15;
        auVar2[10] = cVar16;
        auVar2[0xb] = cVar17;
        auVar2[0xc] = cVar18;
        auVar2[0xd] = cVar19;
        auVar2[0xe] = cVar20;
        auVar2[0xf] = bVar21;
        auVar6[1] = cVar9;
        auVar6[0] = cVar8;
        auVar6[2] = cVar10;
        auVar6[3] = cVar11;
        auVar6[4] = cVar12;
        auVar6[5] = cVar13;
        auVar6[6] = cVar14;
        auVar6[7] = cVar15;
        auVar6[8] = cVar16;
        auVar6[9] = cVar17;
        auVar6[10] = cVar18;
        auVar6[0xb] = cVar19;
        auVar6[0xc] = cVar20;
        auVar6[0xd] = bVar21;
        auVar5[1] = cVar10;
        auVar5[0] = cVar9;
        auVar5[2] = cVar11;
        auVar5[3] = cVar12;
        auVar5[4] = cVar13;
        auVar5[5] = cVar14;
        auVar5[6] = cVar15;
        auVar5[7] = cVar16;
        auVar5[8] = cVar17;
        auVar5[9] = cVar18;
        auVar5[10] = cVar19;
        auVar5[0xb] = cVar20;
        auVar5[0xc] = bVar21;
        auVar4[1] = cVar11;
        auVar4[0] = cVar10;
        auVar4[2] = cVar12;
        auVar4[3] = cVar13;
        auVar4[4] = cVar14;
        auVar4[5] = cVar15;
        auVar4[6] = cVar16;
        auVar4[7] = cVar17;
        auVar4[8] = cVar18;
        auVar4[9] = cVar19;
        auVar4[10] = cVar20;
        auVar4[0xb] = bVar21;
        auVar3[1] = cVar12;
        auVar3[0] = cVar11;
        auVar3[2] = cVar13;
        auVar3[3] = cVar14;
        auVar3[4] = cVar15;
        auVar3[5] = cVar16;
        auVar3[6] = cVar17;
        auVar3[7] = cVar18;
        auVar3[8] = cVar19;
        auVar3[9] = cVar20;
        auVar3[10] = bVar21;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar21,CONCAT18(cVar20,CONCAT17(cVar19,CONCAT16(cVar18
                                                  ,CONCAT15(cVar17,CONCAT14(cVar16,CONCAT13(cVar15,
                                                  CONCAT12(cVar14,CONCAT11(cVar13,cVar12))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar21,CONCAT17(cVar20,CONCAT16(cVar19,CONCAT15(cVar18
                                                  ,CONCAT14(cVar17,CONCAT13(cVar16,CONCAT12(cVar15,
                                                  CONCAT11(cVar14,cVar13)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar21 >> 7) << 0xf) != 0xffff) {
          return false;
        }
        return true;
      }
    }
    iVar7 = nni_strncasecmp((char *)sa.s_storage.sa_pad[0xf],host_local + 0x430,n);
    if (iVar7 == 0) {
      if (((*(char *)(sa.s_storage.sa_pad[0xf] + n) == '\0') ||
          (*(char *)(sa.s_storage.sa_pad[0xf] + n) == ':')) ||
         ((*(char *)(sa.s_storage.sa_pad[0xf] + n) == '.' &&
          (*(char *)(sa.s_storage.sa_pad[0xf] + 1 + n) == '\0')))) {
        h_local._7_1_ = true;
      }
      else {
        h_local._7_1_ = false;
      }
    }
    else {
      h_local._7_1_ = false;
    }
  }
  return h_local._7_1_;
}

Assistant:

static bool
http_handler_host_match(nni_http_handler *h, const char *host)
{
	nng_sockaddr sa;
	size_t       len;

	if ((len = strlen(h->host)) == '\0') {
		return (true);
	}
	if (host == NULL) {
		// Virtual hosts not possible under HTTP/1.0
		return (false);
	}
	if (h->host_ip) {
		if (nni_parse_ip_port(host, &sa) != 0) {
			return (false);
		}
		switch (h->host_addr.s_family) {
		case NNG_AF_INET:
			if ((sa.s_in.sa_family != NNG_AF_INET) ||
			    (sa.s_in.sa_addr != h->host_addr.s_in.sa_addr)) {
				return (false);
			}
			return (true);
		case NNG_AF_INET6:
			if (sa.s_in6.sa_family != NNG_AF_INET6) {
				return (false);
			}
			if (memcmp(sa.s_in6.sa_addr,
			        h->host_addr.s_in6.sa_addr, 16) != 0) {
				return (false);
			}
			return (true);
		}
	}

	if ((nni_strncasecmp(host, h->host, len) != 0)) {
		return (false);
	}

	// At least the first part matches.  If the ending
	// part is a lone "." (legal in DNS), or a port
	// number, we match it.  (We do not validate the
	// port number.)  Note that there may be false matches
	// with IPv6 addresses, but addresses shouldn't be
	// used with virtual hosts anyway.  With both addresses
	// and ports, a false match would be unlikely since
	// they'd still have to *connect* using that info.
	if ((host[len] != '\0') && (host[len] != ':') &&
	    ((host[len] != '.') || (host[len + 1] != '\0'))) {
		return (false);
	}

	return (true);
}